

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O0

Vec_Wrd_t * Vec_WrdReadHex(char *pFileName,int *pnWords,int fVerbose)

{
  int iVar1;
  FILE *__stream;
  FILE *pFile;
  word Num;
  uint local_38;
  int nChars;
  int nWords;
  int c;
  Vec_Wrd_t *p;
  int fVerbose_local;
  int *pnWords_local;
  char *pFileName_local;
  
  local_38 = 0xffffffff;
  Num._4_4_ = 0;
  pFile = (FILE *)0x0;
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for reading.\n",pFileName);
    pFileName_local = (char *)0x0;
  }
  else {
    pFileName_local = (char *)Vec_WrdAlloc(1000);
    while (iVar1 = fgetc(__stream), iVar1 != -1) {
      if ((iVar1 == 10) && (local_38 == 0xffffffff)) {
        local_38 = Vec_WrdSize((Vec_Wrd_t *)pFileName_local);
      }
      if ((((iVar1 != 10) && (iVar1 != 0xd)) && (iVar1 != 9)) && (iVar1 != 0x20)) {
        iVar1 = Vec_WrdReadHexOne((char)iVar1);
        pFile = (FILE *)((long)iVar1 << ((byte)(Num._4_4_ << 2) & 0x3f) | (ulong)pFile);
        Num._4_4_ = Num._4_4_ + 1;
        if (0xf < Num._4_4_) {
          Vec_WrdPush((Vec_Wrd_t *)pFileName_local,(word)pFile);
          Num._4_4_ = 0;
          pFile = (FILE *)0x0;
        }
      }
    }
    iVar1 = Vec_WrdSize((Vec_Wrd_t *)pFileName_local);
    if (iVar1 % (int)local_38 != 0) {
      __assert_fail("Vec_WrdSize(p) % nWords == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x522,"Vec_Wrd_t *Vec_WrdReadHex(char *, int *, int)");
    }
    fclose(__stream);
    if (pnWords != (int *)0x0) {
      *pnWords = local_38;
    }
    if (fVerbose != 0) {
      iVar1 = Vec_WrdSize((Vec_Wrd_t *)pFileName_local);
      printf("Read %d words of simulation data for %d objects.\n",(ulong)local_38,
             (long)iVar1 / (long)(int)local_38 & 0xffffffff);
    }
  }
  return (Vec_Wrd_t *)pFileName_local;
}

Assistant:

static inline Vec_Wrd_t * Vec_WrdReadHex( char * pFileName, int * pnWords, int fVerbose )
{
    Vec_Wrd_t * p = NULL; 
    int c, nWords = -1, nChars = 0; word Num = 0;
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for reading.\n", pFileName );
        return NULL;
    }
    p = Vec_WrdAlloc( 1000 );
    while ( (c = fgetc(pFile)) != EOF )
    {
        if ( c == '\n' && nWords == -1 )
            nWords = Vec_WrdSize(p);
        if ( c == '\n' || c == '\r' || c == '\t' || c == ' ' )
            continue;
        Num |= (word)Vec_WrdReadHexOne((char)c) << (nChars * 4);
        if ( ++nChars < 16 )
            continue;
        Vec_WrdPush( p, Num );
        nChars = 0; 
        Num = 0;
    }
    assert( Vec_WrdSize(p) % nWords == 0 );
    fclose( pFile );
    if ( pnWords )
        *pnWords = nWords;
    if ( fVerbose )
        printf( "Read %d words of simulation data for %d objects.\n", nWords, Vec_WrdSize(p)/nWords );
    return p;
}